

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tape.cpp
# Opt level: O3

void __thiscall InfiniteTape::InfiniteTape(InfiniteTape *this,int64_t opt)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  CellGenerator local_20;
  
  (this->super_BasicTape)._vptr_BasicTape = (_func_int **)&PTR__BasicTape_00121910;
  (this->super_BasicTape).opt = opt;
  CellGenerator::CellGenerator(&(this->super_BasicTape).generator,opt);
  (this->super_BasicTape)._vptr_BasicTape = (_func_int **)&PTR__InfiniteTape_001219a0;
  (this->tape).
  super__List_base<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->tape;
  (this->tape).
  super__List_base<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->tape;
  (this->tape).
  super__List_base<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->it)._M_node = (_List_node_base *)0x0;
  CellGenerator::operator()(&local_20);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  psVar1 = &(this->tape).
            super__List_base<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
            ._M_impl._M_node._M_size;
  p_Var2[1]._M_next = (_List_node_base *)local_20.opt;
  local_20.opt = 0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  *psVar1 = *psVar1 + 1;
  if ((long *)local_20.opt != (long *)0x0) {
    (**(code **)(*(long *)local_20.opt + 8))();
  }
  (this->it)._M_node =
       (this->tape).
       super__List_base<std::unique_ptr<Cell,_std::default_delete<Cell>_>,_std::allocator<std::unique_ptr<Cell,_std::default_delete<Cell>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  return;
}

Assistant:

InfiniteTape::InfiniteTape(int64_t opt) : BasicTape { opt } {
    tape.push_back(generator());
    it = tape.begin();
}